

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.cc
# Opt level: O0

size_t __thiscall
google::protobuf::RepeatedField<absl::lts_20240722::Cord>::SpaceUsedExcludingSelfLong
          (RepeatedField<absl::lts_20240722::Cord> *this)

{
  int iVar1;
  const_reference this_00;
  size_t sVar2;
  undefined4 local_1c;
  size_t sStack_18;
  int i;
  size_t result;
  RepeatedField<absl::lts_20240722::Cord> *this_local;
  
  iVar1 = size(this);
  sStack_18 = (long)iVar1 << 4;
  local_1c = 0;
  while( true ) {
    iVar1 = size(this);
    if (iVar1 <= local_1c) break;
    this_00 = Get(this,local_1c);
    sVar2 = absl::lts_20240722::Cord::size(this_00);
    sStack_18 = sVar2 + sStack_18;
    local_1c = local_1c + 1;
  }
  return sStack_18;
}

Assistant:

PROTOBUF_EXPORT_TEMPLATE_DEFINE size_t
RepeatedField<absl::Cord>::SpaceUsedExcludingSelfLong() const {
  size_t result = size() * sizeof(absl::Cord);
  for (int i = 0; i < size(); i++) {
    // Estimate only.
    result += Get(i).size();
  }
  return result;
}